

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

_Bool roaring64_bitmap_iterate(roaring64_bitmap_t *r,roaring_iterator64 iterator,void *ptr)

{
  _Bool _Var1;
  undefined4 uVar2;
  container_t *c;
  ulong uVar3;
  leaf_t leaf;
  uint32_t low32;
  uint64_t high32;
  uint64_t high48;
  art_iterator_t it;
  container_t *in_stack_ffffffffffffff28;
  roaring64_bitmap_t *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  art_t *in_stack_ffffffffffffff40;
  undefined8 *local_a8;
  
  art_init_iterator(in_stack_ffffffffffffff40,SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  while( true ) {
    if (local_a8 == (undefined8 *)0x0) {
      return true;
    }
    c = (container_t *)
        combine_key((uint8_t *)in_stack_ffffffffffffff30,
                    (uint16_t)((ulong)in_stack_ffffffffffffff28 >> 0x30));
    uVar3 = (ulong)c & 0xffffffff00000000;
    uVar2 = SUB84(c,0);
    in_stack_ffffffffffffff30 = (roaring64_bitmap_t *)*local_a8;
    in_stack_ffffffffffffff28 =
         get_container(in_stack_ffffffffffffff30,(leaf_t)in_stack_ffffffffffffff28);
    get_typecode((leaf_t)in_stack_ffffffffffffff30);
    _Var1 = container_iterate64(c,(uint8_t)(uVar3 >> 0x38),(uint32_t)uVar3,
                                (roaring_iterator64)CONCAT44(uVar2,in_stack_ffffffffffffff38),
                                (uint64_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (!_Var1) break;
    art_iterator_next((art_iterator_t *)0x12553a);
  }
  return false;
}

Assistant:

bool roaring64_bitmap_iterate(const roaring64_bitmap_t *r,
                              roaring_iterator64 iterator, void *ptr) {
    art_iterator_t it = art_init_iterator((art_t *)&r->art, /*first=*/true);
    while (it.value != NULL) {
        uint64_t high48 = combine_key(it.key, 0);
        uint64_t high32 = high48 & 0xFFFFFFFF00000000ULL;
        uint32_t low32 = high48;
        leaf_t leaf = (leaf_t)*it.value;
        if (!container_iterate64(get_container(r, leaf), get_typecode(leaf),
                                 low32, iterator, high32, ptr)) {
            return false;
        }
        art_iterator_next(&it);
    }
    return true;
}